

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O3

void __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  BuildPrim *pBVar1;
  BuildPrim *pBVar2;
  uint uVar3;
  UserGeometry *pUVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  char cVar10;
  uint uVar11;
  runtime_error *prVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_class_8_1_8991fb9c calculateCentBounds;
  MortonCodeMapping mapping;
  BBox3fa box;
  auto_partitioner local_169;
  undefined1 local_168 [8];
  undefined8 uStack_160;
  undefined1 local_158 [16];
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
  *local_140;
  undefined1 local_138 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  undefined8 local_f8;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  *local_f0;
  anon_class_8_1_898bcfc2 local_e8;
  BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<8>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<8>,_8>::Create,_embree::avx::SetBVHNBounds<8>,_embree::avx::CreateMortonLeaf<8,_embree::Object>,_embree::avx::CalculateMeshBounds<embree::UserGeometry>,_embree::Scene::BuildProgressMonitorInterface>
  **local_e0;
  undefined1 local_d8 [8];
  __atomic_base<unsigned_int> _Stack_d0;
  float fStack_cc;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_c8;
  float fStack_c0;
  float fStack_bc;
  intrusive_list_node local_b8;
  string_resource_index local_98;
  blocked_range<unsigned_int> local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar11 = current->_begin;
  uVar14 = (ulong)uVar11;
  uVar3 = current->_end;
  uVar13 = (ulong)uVar3;
  if (uVar3 - uVar11 < 0x400) {
    if (uVar11 < uVar3) {
      auVar30._8_4_ = 0x7f800000;
      auVar30._0_8_ = 0x7f8000007f800000;
      auVar30._12_4_ = 0x7f800000;
      auVar15._8_4_ = 0xff800000;
      auVar15._0_8_ = 0xff800000ff800000;
      auVar15._12_4_ = 0xff800000;
      do {
        local_158 = auVar30;
        pUVar4 = this->calculateBounds->mesh;
        local_138._8_4_ = this->morton[uVar14].field_0.field_0.index;
        local_138._0_8_ = (pUVar4->super_AccelSet).super_Geometry.userPtr;
        local_138._12_4_ = 0;
        local_138._16_8_ = local_d8;
        _local_168 = auVar15;
        (**(code **)&(pUVar4->super_AccelSet).super_Geometry.field_0x58)(local_138);
        auVar16._0_4_ = (float)local_d8._0_4_ + (float)local_c8._0_4_;
        auVar16._4_4_ = (float)local_d8._4_4_ + (float)local_c8._4_4_;
        auVar16._8_4_ = (float)_Stack_d0._M_i + fStack_c0;
        auVar16._12_4_ = fStack_cc + fStack_bc;
        auVar30 = vminps_avx(local_158,auVar16);
        auVar15 = vmaxps_avx(_local_168,auVar16);
        uVar14 = uVar14 + 1;
        uVar13 = (ulong)current->_end;
      } while (uVar14 < uVar13);
      uVar14 = (ulong)current->_begin;
      _local_168 = auVar15;
    }
    else {
      auVar15._8_4_ = 0xff800000;
      auVar15._0_8_ = 0xff800000ff800000;
      auVar15._12_4_ = 0xff800000;
      auVar30._8_4_ = 0x7f800000;
      auVar30._0_8_ = 0x7f8000007f800000;
      auVar30._12_4_ = 0x7f800000;
    }
    uVar11 = (uint)uVar14;
    if (uVar11 < (uint)uVar13) {
      auVar22 = vsubps_avx(auVar15,auVar30);
      auVar23._8_4_ = 0x1fec1e4a;
      auVar23._0_8_ = 0x1fec1e4a1fec1e4a;
      auVar23._12_4_ = 0x1fec1e4a;
      auVar28 = vcmpps_avx(auVar22,auVar23,6);
      auVar24 = vrcpps_avx(auVar22);
      fVar6 = auVar24._0_4_;
      auVar17._0_4_ = auVar22._0_4_ * fVar6;
      fVar7 = auVar24._4_4_;
      auVar17._4_4_ = auVar22._4_4_ * fVar7;
      fVar8 = auVar24._8_4_;
      auVar17._8_4_ = auVar22._8_4_ * fVar8;
      fVar9 = auVar24._12_4_;
      auVar17._12_4_ = auVar22._12_4_ * fVar9;
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = 0x3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar24 = vsubps_avx(auVar29,auVar17);
      auVar18._0_4_ = (fVar6 + fVar6 * auVar24._0_4_) * 1013.76;
      auVar18._4_4_ = (fVar7 + fVar7 * auVar24._4_4_) * 1013.76;
      auVar18._8_4_ = (fVar8 + fVar8 * auVar24._8_4_) * 1013.76;
      auVar18._12_4_ = (fVar9 + fVar9 * auVar24._12_4_) * 1013.76;
      _local_168 = vandps_avx(auVar28,auVar18);
      local_158 = auVar30;
      do {
        pUVar4 = this->calculateBounds->mesh;
        local_138._8_4_ = this->morton[uVar14].field_0.field_0.index;
        local_138._0_8_ = (pUVar4->super_AccelSet).super_Geometry.userPtr;
        local_138._12_4_ = 0;
        local_138._16_8_ = local_d8;
        (**(code **)&(pUVar4->super_AccelSet).super_Geometry.field_0x58)(local_138);
        auVar19._0_4_ = (float)local_d8._0_4_ + (float)local_c8._0_4_;
        auVar19._4_4_ = (float)local_d8._4_4_ + (float)local_c8._4_4_;
        auVar19._8_4_ = (float)_Stack_d0._M_i + fStack_c0;
        auVar19._12_4_ = fStack_cc + fStack_bc;
        auVar28 = vsubps_avx(auVar19,local_158);
        auVar20._0_4_ = auVar28._0_4_ * (float)local_168._0_4_;
        auVar20._4_4_ = auVar28._4_4_ * (float)local_168._4_4_;
        auVar20._8_4_ = auVar28._8_4_ * (float)uStack_160;
        auVar20._12_4_ = auVar28._12_4_ * uStack_160._4_4_;
        auVar28 = vcvtps2dq_avx(auVar20);
        uVar11 = vextractps_avx(auVar28,1);
        uVar11 = (uVar11 << 0x10 | uVar11) & 0x30000ff;
        uVar11 = (uVar11 << 8 | uVar11) & 0x300f00f;
        auVar28 = vshufps_avx(auVar28,auVar28,0xe8);
        auVar24 = vpslld_avx(auVar28,0x10);
        auVar28 = vpor_avx(auVar24,auVar28);
        auVar25._8_4_ = 0x30000ff;
        auVar25._0_8_ = 0x30000ff030000ff;
        auVar25._12_4_ = 0x30000ff;
        auVar28 = vpand_avx(auVar28,auVar25);
        auVar24 = vpslld_avx(auVar28,8);
        auVar28 = vpor_avx(auVar28,auVar24);
        auVar26._8_4_ = 0x300f00f;
        auVar26._0_8_ = 0x300f00f0300f00f;
        auVar26._12_4_ = 0x300f00f;
        auVar28 = vpand_avx(auVar28,auVar26);
        auVar24 = vpslld_avx(auVar28,4);
        auVar28 = vpor_avx(auVar28,auVar24);
        auVar27._8_4_ = 0x30c30c3;
        auVar27._0_8_ = 0x30c30c3030c30c3;
        auVar27._12_4_ = 0x30c30c3;
        auVar28 = vpand_avx(auVar28,auVar27);
        auVar28 = vpmulld_avx(auVar28,_DAT_01fb7070);
        auVar28 = vpand_avx(auVar28,_DAT_01fb7080);
        this->morton[uVar14].field_0.field_0.code =
             auVar28._4_4_ | auVar28._0_4_ | ((uVar11 << 4 | uVar11) & 0x30c30c3) * 10 & 0x12492492;
        uVar14 = uVar14 + 1;
        uVar13 = (ulong)current->_end;
      } while (uVar14 < uVar13);
      uVar11 = current->_begin;
    }
    if (uVar11 != (uint)uVar13) {
      pBVar1 = this->morton + uVar13;
      pBVar2 = this->morton + uVar11;
      uVar13 = (long)(uVar13 * 8 + (ulong)uVar11 * -8) >> 3;
      lVar5 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<embree::avx::BVHBuilderMorton::BuildPrim*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<embree::avx::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1);
    }
  }
  else {
    local_58.my_end = 0x7f800000;
    local_58.my_begin = 0x7f800000;
    local_58.my_grainsize = 0x7f8000007f800000;
    local_48 = 0xff800000;
    uStack_44 = 0xff800000;
    uStack_40 = 0xff800000;
    uStack_3c = 0xff800000;
    fStack_cc._0_1_ = proxy_support;
    fStack_cc._1_1_ = (context_traits)0x4;
    local_b8 = (intrusive_list_node)ZEXT816(0);
    local_98 = CUSTOM_CTX;
    local_140 = this;
    tbb::detail::r1::initialize((task_group_context *)local_d8);
    local_f8._4_4_ = uVar11;
    local_f8._0_4_ = uVar3;
    local_f0 = (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
                *)0x400;
    local_e8.func = (anon_class_16_2_00173b7b *)BBox<embree::Vec3fa>::merge;
    local_e0 = &local_140;
    local_138._8_8_ = &local_e8;
    local_138._0_8_ = &local_58;
    local_138._16_8_ = BBox<embree::Vec3fa>::merge;
    local_118.m128[0] = INFINITY;
    local_118.m128[1] = INFINITY;
    local_118.m128[2] = INFINITY;
    local_118.m128[3] = INFINITY;
    local_108.m128[0] = -INFINITY;
    local_108.m128[1] = -INFINITY;
    local_108.m128[2] = -INFINITY;
    local_108.m128[3] = -INFINITY;
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<unsigned_int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)&local_f8,
          (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
           *)local_138,&local_169,(task_group_context *)local_d8);
    local_168._4_4_ = local_118.m128[1];
    local_168._0_4_ = local_118.m128[0];
    uStack_160._4_4_ = local_118.m128[3];
    uStack_160._0_4_ = local_118.m128[2];
    local_158._4_4_ = local_108.m128[1];
    local_158._0_4_ = local_108.m128[0];
    local_158._12_4_ = local_108.m128[3];
    local_158._8_4_ = local_108.m128[2];
    cVar10 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_d8);
    if (cVar10 != '\0') {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"task cancelled");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_d8);
    local_138._0_16_ = _local_168;
    auVar22 = vsubps_avx(local_158,_local_168);
    auVar28._8_4_ = 0x1fec1e4a;
    auVar28._0_8_ = 0x1fec1e4a1fec1e4a;
    auVar28._12_4_ = 0x1fec1e4a;
    auVar28 = vcmpps_avx(auVar22,auVar28,6);
    auVar24 = vrcpps_avx(auVar22);
    fVar6 = auVar24._0_4_;
    auVar21._0_4_ = auVar22._0_4_ * fVar6;
    fVar7 = auVar24._4_4_;
    auVar21._4_4_ = auVar22._4_4_ * fVar7;
    fVar8 = auVar24._8_4_;
    auVar21._8_4_ = auVar22._8_4_ * fVar8;
    fVar9 = auVar24._12_4_;
    auVar21._12_4_ = auVar22._12_4_ * fVar9;
    auVar24._8_4_ = 0x3f800000;
    auVar24._0_8_ = 0x3f8000003f800000;
    auVar24._12_4_ = 0x3f800000;
    auVar24 = vsubps_avx(auVar24,auVar21);
    auVar22._0_4_ = (fVar6 + fVar6 * auVar24._0_4_) * 1013.76;
    auVar22._4_4_ = (fVar7 + fVar7 * auVar24._4_4_) * 1013.76;
    auVar22._8_4_ = (fVar8 + fVar8 * auVar24._8_4_) * 1013.76;
    auVar22._12_4_ = (fVar9 + fVar9 * auVar24._12_4_) * 1013.76;
    local_138._16_16_ = vandps_avx(auVar28,auVar22);
    fStack_cc = (float)CONCAT22(fStack_cc._2_2_,0x401);
    local_b8 = (intrusive_list_node)(ZEXT816(0) << 0x20);
    local_98 = CUSTOM_CTX;
    uStack_160 = 0;
    local_168._0_4_ = current->_begin;
    local_168._4_4_ = current->_end;
    local_f8 = this;
    local_f0 = (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
                *)local_138;
    tbb::detail::r1::initialize((task_group_context *)local_d8);
    auVar28 = vpermilps_avx(_local_168,0xe1);
    local_58._0_8_ = vmovlps_avx(auVar28);
    local_58.my_grainsize = 0x400;
    local_e8.func = (anon_class_16_2_00173b7b *)&local_f8;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run(&local_58,&local_e8,&local_169,(task_group_context *)local_d8);
    cVar10 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_d8);
    if (cVar10 != '\0') {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"task cancelled");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)local_d8);
    tbb::detail::d1::
    parallel_sort<embree::avx::BVHBuilderMorton::BuildPrim*,std::less<embree::avx::BVHBuilderMorton::BuildPrim>>
              (this->morton + current->_begin,this->morton + current->_end,
               (less<embree::avx::BVHBuilderMorton::BuildPrim> *)local_d8);
  }
  return;
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }